

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjasm.cpp
# Opt level: O3

void __thiscall
Options::COptionsParser::GetOptions(COptionsParser *this,char **argv,int *i,bool onlySyntaxOptions)

{
  char *v1;
  char *__args;
  char cVar1;
  char cVar2;
  long lVar3;
  bool bVar4;
  byte bVar5;
  path *ppVar6;
  path *ppVar7;
  int iVar8;
  path *this_00;
  char *pcVar9;
  char *message;
  char defN [2048];
  char defV [2048];
  SSource local_1848;
  char local_838 [2056];
  
  pcVar9 = argv[*i];
  this->arg = pcVar9;
  if (pcVar9 != (char *)0x0) {
    v1 = this->opt;
    __args = this->val;
    do {
      if (*pcVar9 != '-') {
        return;
      }
      cVar1 = pcVar9[1];
      if (cVar1 == '-') {
        splitByChar(pcVar9 + 2,0x3d,v1,0x800,__args,0x800);
      }
      else {
        this->opt[0] = cVar1;
        this->opt[1] = '\0';
        if (cVar1 != '\0') {
          strcpy(__args,pcVar9 + 2);
        }
      }
      if (*(int *)(this->opt + 3) == 0x747865 && *(int *)v1 == 0x656e787a) {
        if (IsI8080 == '\x01') {
          Error("Can\'t enable Next extensions while in i8080 mode",(char *)0x0,FATAL);
        }
        if (IsLR35902 == '\x01') {
          Error("Can\'t enable Next extensions while in Sharp LR35902 mode",(char *)0x0,FATAL);
        }
        DAT_0018e51c = (*(int *)(this->val + 3) == 0x746365 && *(int *)__args == 0x65707363) + 1;
      }
      else if (*(long *)(this->opt + 3) == 0x706f7065737265 && *(long *)v1 == 0x7065737265766572) {
        DAT_0018e509 = 1;
      }
      else if (*(int *)(this->opt + 3) == 0x6c6f62 && *(int *)v1 == 0x62726964) {
        syx = 1;
      }
      else {
        lVar3 = *(long *)v1;
        if (lVar3 == 0x73656b61666f6e) {
          DAT_0018e50a = 0;
        }
        else if (*(int *)(this->opt + 3) == 0x786174 && *(int *)v1 == 0x746e7973) {
          parseSyntaxValue(this);
        }
        else if ((char)lVar3 == 'W' && cVar1 != '-') {
          CliWoption(__args);
        }
        else {
          if (onlySyntaxOptions) {
            return;
          }
          if (lVar3 == 0x3230393533726c) {
            IsLR35902 = '\x01';
            IsI8080 = '\0';
          }
          else {
            if (*(short *)(this->opt + 4) != 0x30 || *(int *)v1 != 0x38303869) {
              cVar2 = *__args;
              if (((char)lVar3 == 'h' && cVar1 != '-') && cVar2 == '\0') {
LAB_001281d2:
                bVar4 = this->val[8] == '\0';
                ShowHelp = ShowHelp | (!bVar4 || *(long *)__args != 0x73676e696e726177);
                ShowHelpWarnings =
                     ShowHelpWarnings | (bVar4 && *(long *)__args == 0x73676e696e726177);
              }
              else {
                if (cVar1 == '-') {
                  if (this->opt[4] == '\0' && *(int *)v1 == 0x706c6568) goto LAB_001281d2;
                  if (lVar3 == 0x6e6f6973726576) {
                    ShowVersion = 1;
                    goto LAB_00128216;
                  }
                }
                if (*(int *)(this->opt + 3) == 0x62616c && *(int *)v1 == 0x6c74736c) {
                  AddLabelListing = 1;
                  if (cVar2 != '\0') {
                    SortSymbols = this->val[4] == '\0' && *(int *)__args == 0x74726f73;
                  }
                }
                else if (lVar3 == 0x727470676e6f6c) {
                  IsLongPtr = 1;
                }
                else {
                  iVar8 = (int)lVar3;
                  if (iVar8 == 0x67736d) {
                    if (this->val[4] == '\0' && *(int *)__args == 0x656e6f6e) {
                      OutputVerbosity = 3;
LAB_00128583:
                      HideLogo = 1;
                    }
                    else {
                      iVar8 = *(int *)__args;
                      if (iVar8 < 0x727265) {
                        if (iVar8 == 0x6c6c61) {
                          OutputVerbosity = 0;
                        }
                        else if (iVar8 == 0x726177) {
                          OutputVerbosity = 1;
                        }
                        else {
LAB_00128534:
                          if (*(int *)(this->val + 3) != 0x62616c || *(int *)__args != 0x6c74736c) {
                            message = "unexpected parameter in";
                            pcVar9 = this->arg;
                            goto LAB_00128557;
                          }
                          OutputVerbosity = 4;
                          AddLabelListing = 1;
                          SortSymbols = 1;
                          HideLogo = 1;
                        }
                      }
                      else {
                        if (iVar8 == 0x74736c) {
                          OutputVerbosity = 4;
                          AddLabelListing = 0;
                          goto LAB_00128583;
                        }
                        if (iVar8 != 0x727265) goto LAB_00128534;
                        OutputVerbosity = 2;
                      }
                    }
                  }
                  else if (iVar8 == 0x74736c && cVar2 == '\0') {
                    IsDefaultListingName = 1;
                  }
                  else if (iVar8 == 0x646c73 && cVar2 == '\0') {
                    IsDefaultSldName = 1;
                  }
                  else {
                    iVar8 = CheckAssignmentOption(this,"outprefix",(path *)OutPrefix_abi_cxx11_);
                    if (((((iVar8 == 0) &&
                          (iVar8 = CheckAssignmentOption
                                             (this,"sym",(path *)&SymbolListFName_abi_cxx11_),
                          iVar8 == 0)) &&
                         (iVar8 = CheckAssignmentOption(this,"lst",(path *)ListingFName_abi_cxx11_),
                         iVar8 == 0)) &&
                        ((iVar8 = CheckAssignmentOption(this,"exp",(path *)&ExportFName_abi_cxx11_),
                         iVar8 == 0 &&
                         (iVar8 = CheckAssignmentOption
                                            (this,"sld",(path *)&SourceLevelDebugFName_abi_cxx11_),
                         iVar8 == 0)))) &&
                       (iVar8 = CheckAssignmentOption(this,"raw",(path *)&RAWFName_abi_cxx11_),
                       ppVar7 = DAT_0018e558, ppVar6 = IncludeDirsList_abi_cxx11_, iVar8 == 0)) {
                      pcVar9 = __args;
                      if (this->opt[8] == '\0' && *(long *)v1 == 0x687461706c6c7566) {
                        if (this->val[2] == '\0' && *(short *)__args == 0x6e6f) {
                          FileVerbosity = 2;
                        }
                        else if (*(int *)__args == 0x6c6572 || *__args == '\0') {
                          FileVerbosity = 1;
                        }
                        else {
                          if (*(int *)__args != 0x66666f) {
                            message = "invalid --fullpath setting (use: on|rel|off)";
                            goto LAB_00128557;
                          }
                          FileVerbosity = 0;
                        }
                      }
                      else if (*(short *)(this->opt + 4) == 0x72 && *(int *)v1 == 0x6f6c6f63) {
                        if (this->val[2] == '\0' && *(short *)__args == 0x6e6f) {
                          tcols = tcols_ansi;
                        }
                        else if (*(int *)__args == 0x66666f) {
                          tcols = (undefined *)&tcols_none;
                        }
                        else if (this->val[4] != '\0' || *(int *)__args != 0x6f747561) {
                          message = "invalid --color setting (use: on|off|auto)";
                          goto LAB_00128557;
                        }
                      }
                      else {
                        if (*(int *)(this->opt + 3) == 0x6f676f && *(int *)v1 == 0x6f6c6f6e)
                        goto LAB_00128583;
                        if (*(int *)(this->opt + 3) == 0x363638 && *(int *)v1 == 0x38736f64) {
                          ConvertEncoding = 0;
                        }
                        else if ((cVar1 == '-' && *(int *)v1 == 0x636e69) ||
                                (bVar5 = (byte)*(int *)v1, (bVar5 & 0xdf) == 0x49 && cVar1 != '-'))
                        {
                          if (*__args == '\0') {
                            if ((cVar1 == '-') && (this->arg[5] != '=')) {
                              this_00 = IncludeDirsList_abi_cxx11_;
                              if (DAT_0018e558 != IncludeDirsList_abi_cxx11_) {
                                do {
                                  std::filesystem::__cxx11::path::~path(this_00);
                                  this_00 = this_00 + 1;
                                } while (this_00 != ppVar7);
                                DAT_0018e558 = ppVar6;
                              }
                            }
                            else {
                              iVar8 = *i;
                              if ((argv[(long)iVar8 + 1] == (char *)0x0) ||
                                 (*argv[(long)iVar8 + 1] == '-')) {
                                message = "no include path found for";
                                pcVar9 = this->arg;
                                goto LAB_00128557;
                              }
                              *i = iVar8 + 1;
                              std::
                              vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>
                              ::emplace_back<char_const*const&>
                                        ((vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>
                                          *)&IncludeDirsList_abi_cxx11_,argv + (long)iVar8 + 1);
                            }
                          }
                          else {
                            std::
                            vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>
                            ::emplace_back<char(&)[2048]>
                                      ((vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>
                                        *)&IncludeDirsList_abi_cxx11_,(char (*) [2048])__args);
                          }
                        }
                        else if (*(int *)(this->opt + 3) == 0x656e69 && *(int *)v1 == 0x69666564) {
                          pcVar9 = argv[(long)*i + 1];
                          if (pcVar9 == (char *)0x0) {
                            memset(&local_1848,0,0x800);
                            memset(local_838,0,0x800);
                          }
                          else {
                            *i = *i + 1;
                            memset(&local_1848,0,0x800);
                            memset(local_838,0,0x800);
                            splitByChar(pcVar9,0x3d,local_1848.fname,0x800,local_838,0x800);
                            if (local_1848.fname[0] != '\0') goto LAB_00128793;
                          }
                          message = "missing define value";
LAB_00128557:
                          Error(message,pcVar9,ALL);
                        }
                        else if (bVar5 == 0x44 && cVar1 != '-') {
                          if (*__args == '\0') {
                            message = "no parameters found in";
                            pcVar9 = this->arg;
                            goto LAB_00128557;
                          }
                          splitByChar(__args,0x3d,local_1848.fname,0x800,local_838,0x800);
LAB_00128793:
                          CDefineTable::Add((CDefineTable *)CmdDefineTable,local_1848.fname,
                                            local_838,(CStringsList *)0x0);
                        }
                        else {
                          if (bVar5 != 0 || cVar1 == '-') {
                            message = "unrecognized option";
                            pcVar9 = this->arg;
                            goto LAB_00128557;
                          }
                          local_1848.fname[0] = '\0';
                          local_1848.stdin_log = (stdin_log_t *)operator_new(0x18);
                          ((local_1848.stdin_log)->super__Vector_base<char,_std::allocator<char>_>).
                          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                          ((local_1848.stdin_log)->super__Vector_base<char,_std::allocator<char>_>).
                          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                          ((local_1848.stdin_log)->super__Vector_base<char,_std::allocator<char>_>).
                          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                          std::vector<char,_std::allocator<char>_>::reserve
                                    (local_1848.stdin_log,0xc800);
                          std::vector<SSource,_std::allocator<SSource>_>::emplace_back<SSource>
                                    (&sourceFiles,&local_1848);
                          SSource::~SSource(&local_1848);
                        }
                      }
                    }
                  }
                }
              }
              goto LAB_00128216;
            }
            IsI8080 = '\x01';
            IsLR35902 = '\0';
          }
          DAT_0018e51c = 0;
        }
      }
LAB_00128216:
      iVar8 = *i;
      *i = iVar8 + 1;
      pcVar9 = argv[(long)iVar8 + 1];
      this->arg = pcVar9;
    } while (pcVar9 != (char *)0x0);
  }
  return;
}

Assistant:

void GetOptions(const char* const * const argv, int& i, bool onlySyntaxOptions = false) {
			while ((arg=argv[i]) && ('-' == arg[0])) {
				bool doubleDash = false;
				// copy "option" (up to '=' char) into `opt`, copy "value" (after '=') into `val`
				if ('-' == arg[1]) {	// double-dash detected, value is expected after "="
					doubleDash = true;
					splitByChar(arg + 2, '=', opt, LINEMAX, val, LINEMAX);
				} else {				// single dash, parse value from second character onward
					opt[0] = arg[1];	// copy only single letter into `opt`
					opt[1] = 0;
					if (opt[0]) {		// if it was not empty, try to copy also `val`
						STRCPY(val, LINEMAX, arg + 2);
					}
				}

				// check for particular options and setup option value by it
				// first check all syntax-only options which may be modified by OPT directive
				if (!strcmp(opt, "zxnext")) {
					if (IsI8080) Error("Can't enable Next extensions while in i8080 mode", nullptr, FATAL);
					if (IsLR35902) Error("Can't enable Next extensions while in Sharp LR35902 mode", nullptr, FATAL);
					syx.IsNextEnabled = 1;
					if (!strcmp(val, "cspect")) syx.IsNextEnabled = 2;	// CSpect emulator extensions
				} else if (!strcmp(opt, "reversepop")) {
					syx.IsReversePOP = true;
				} else if (!strcmp(opt, "dirbol")) {
					syx.IsPseudoOpBOF = true;
				} else if (!strcmp(opt, "nofakes")) {
					syx.FakeEnabled = false;
					// was deprecated, as it is provided by `--syntax=F` too, but now I decided to keep also this older option
					// (it's less cryptic than the --syntax letter soup, one duplicity of functionality will not end the world, right?)
				} else if (!strcmp(opt, "syntax")) {
					parseSyntaxValue();
				} else if (!doubleDash && 'W' == opt[0]) {
					CliWoption(val);
				} else if (onlySyntaxOptions) {
					// rest of the options is available only when launching the sjasmplus
					return;
				} else if (!strcmp(opt, "lr35902")) {
					IsLR35902 = true;
					// force (silently) other CPU modes OFF
					IsI8080 = false;
					syx.IsNextEnabled = 0;
				} else if (!strcmp(opt, "i8080")) {
					IsI8080 = true;
					// force (silently) other CPU modes OFF
					IsLR35902 = false;
					syx.IsNextEnabled = 0;
				} else if ((!doubleDash && 'h' == opt[0] && !val[0]) || (doubleDash && !strcmp(opt, "help"))) {
					ShowHelp |= !!strcmp("warnings", val);
					ShowHelpWarnings |= !strcmp("warnings", val);
				} else if (doubleDash && !strcmp(opt, "version")) {
					ShowVersion = true;
				} else if (!strcmp(opt, "lstlab")) {
					AddLabelListing = true;
					if (val[0]) SortSymbols = !strcmp("sort", val);
				} else if (!strcmp(opt, "longptr")) {
					IsLongPtr = true;
				} else if (!strcmp(opt, "msg")) {
					if (!strcmp("none", val)) {
						OutputVerbosity = OV_NONE;
						HideLogo = true;
					} else if (!strcmp("err", val)) {
						OutputVerbosity = OV_ERROR;
					} else if (!strcmp("war", val)) {
						OutputVerbosity = OV_WARNING;
					} else if (!strcmp("all", val)) {
						OutputVerbosity = OV_ALL;
					} else if (!strcmp("lst", val)) {
						OutputVerbosity = OV_LST;
						AddLabelListing = false;
						HideLogo = true;
					} else if (!strcmp("lstlab", val)) {
						OutputVerbosity = OV_LST;
						AddLabelListing = true;
						SortSymbols = true;
						HideLogo = true;
					} else {
						Error("unexpected parameter in", arg, ALL);
					}
				} else if (!strcmp(opt, "lst") && !val[0]) {
					IsDefaultListingName = true;
				} else if (!strcmp(opt, "sld") && !val[0]) {
					IsDefaultSldName = true;
				} else if (
					CheckAssignmentOption("outprefix", OutPrefix) ||
					CheckAssignmentOption("sym", SymbolListFName) ||
					CheckAssignmentOption("lst", ListingFName) ||
					CheckAssignmentOption("exp", ExportFName) ||
					CheckAssignmentOption("sld", SourceLevelDebugFName) ||
					CheckAssignmentOption("raw", RAWFName) ) {
					// was proccessed inside CheckAssignmentOption function
				} else if (!strcmp(opt, "fullpath")) {
					if (!strcmp("on", val)) {
						FileVerbosity = FNAME_ABSOLUTE;
					} else if (!val[0] || !strcmp("rel", val)) {
						FileVerbosity = FNAME_LAUNCH_REL;
					} else if (!strcmp("off", val)) {
						FileVerbosity = FNAME_BASE;
					} else {
						Error("invalid --fullpath setting (use: on|rel|off)", val, ALL);
					}
				} else if (!strcmp(opt, "color")) {
					if (!strcmp("on", val)) {
						SetTerminalColors(true);
					} else if (!strcmp("off", val)) {
						SetTerminalColors(false);
					} else if (!strcmp("auto", val)) {
						// already heuristically detected, nothing to do
					} else {
						Error("invalid --color setting (use: on|off|auto)", val, ALL);
					}
				} else if (!strcmp(opt, "nologo")) {
					HideLogo = 1;
				} else if (!strcmp(opt, "dos866")) {
					ConvertEncoding = ENCDOS;
				} else if ((doubleDash && !strcmp(opt, "inc")) ||
							(!doubleDash && 'i' == opt[0]) ||
							(!doubleDash && 'I' == opt[0])) {
					if (*val) {
						IncludeDirsList.emplace_back(val);
					} else {
						if (!doubleDash || '=' == arg[5]) {
							if (argv[i+1] && '-' != argv[i+1][0]) {		// include path provided as next argument (after space, like gcc)
								IncludeDirsList.emplace_back(argv[++i]);
							} else {
								Error("no include path found for", arg, ALL);
							}
						} else {	// individual `--inc` without "= path" will RESET include dirs
							IncludeDirsList.clear();
						}
					}
				} else if (!strcmp(opt, "define")) {	// for --define name=value the next argv is used (if available)
					const char* defarg = argv[i+1] ? argv[++i] : nullptr;
					char defN[LINEMAX] {}, defV[LINEMAX] {};
					if (defarg) splitByChar(defarg, '=', defN, LINEMAX, defV, LINEMAX);
					if (*defN) CmdDefineTable.Add(defN, defV, nullptr);
					else Error("missing define value", defarg, ALL);
				} else if (!doubleDash && 'D' == opt[0]) {
					char defN[LINEMAX], defV[LINEMAX];
					if (*val) {		// for -Dname=value the `val` contains "name=value" string
						splitByChar(val, '=', defN, LINEMAX, defV, LINEMAX);
						CmdDefineTable.Add(defN, defV, NULL);
					} else {
						Error("no parameters found in", arg, ALL);
					}
				} else if (!doubleDash && 0 == opt[0]) {
					// only single "-" was on command line = source STDIN
					sourceFiles.push_back(SSource(1));		// special constructor for stdin input
				} else {
					Error("unrecognized option", arg, ALL);
				}

				++i;					// next CLI argument
			} // end of while ((arg=argv[i]) && ('-' == arg[0]))
		}